

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O2

void __thiscall
Utf8Decode_IllegalCodePositions_Test::Utf8Decode_IllegalCodePositions_Test
          (Utf8Decode_IllegalCodePositions_Test *this)

{
  anon_unknown.dwarf_198f1d::Utf8Decode::Utf8Decode(&this->super_Utf8Decode);
  (this->super_Utf8Decode).super_Test._vptr_Test = (_func_int **)&PTR__Test_002163b8;
  return;
}

Assistant:

TEST_F (Utf8Decode, IllegalCodePositions) {
    // Single UTF-16 surrogates
    decode_bad (bytes ({0xED, 0xA0, 0x80})); // U+D800
    decode_bad (bytes ({0xED, 0xAD, 0xBF})); // U+DB7F
    decode_bad (bytes ({0xED, 0xAE, 0x80})); // U+DB80
    decode_bad (bytes ({0xED, 0xAF, 0xBF})); // U+DBFF
    decode_bad (bytes ({0xED, 0xB0, 0x80})); // U+DC00
    decode_bad (bytes ({0xED, 0xBE, 0x80})); // U+DF80
    decode_bad (bytes ({0xED, 0xBF, 0xBF})); // U+DFFF

    // Paired UTF-16 surrogates
    decode_bad (bytes ({0xED, 0xA0, 0x80, 0xED, 0xB0, 0x80})); // U+D800 U+DC00
    decode_bad (bytes ({0xED, 0xA0, 0x80, 0xED, 0xBF, 0xBF})); // U+D800 U+DFFF
    decode_bad (bytes ({0xED, 0xAD, 0xBF, 0xED, 0xB0, 0x80})); // U+DB7F U+DC00
    decode_bad (bytes ({0xED, 0xAD, 0xBF, 0xED, 0xBF, 0xBF})); // U+DB7F U+DFFF
    decode_bad (bytes ({0xED, 0xAE, 0x80, 0xED, 0xB0, 0x80})); // U+DB80 U+DC00
    decode_bad (bytes ({0xED, 0xAE, 0x80, 0xED, 0xBF, 0xBF})); // U+DB80 U+DFFF
    decode_bad (bytes ({0xED, 0xAF, 0xBF, 0xED, 0xB0, 0x80})); // U+DBFF U+DC00
    decode_bad (bytes ({0xED, 0xAF, 0xBF, 0xED, 0xBF, 0xBF})); // U+DBFF U+DFFF
}